

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * findlocal(lua_State *L,CallInfo *ci,int n,StkId *pos)

{
  Proto *f;
  int pc;
  char *pcVar1;
  StkId local_60;
  StkId limit;
  StkId base;
  char *name;
  StkId *pos_local;
  int n_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  base = (StkId)0x0;
  if ((ci->callstatus & 2) == 0) {
    limit = ci->func + 1;
  }
  else {
    if (n < 0) {
      pcVar1 = findvararg(ci,-n,pos);
      return pcVar1;
    }
    limit = (ci->u).l.base;
    f = *(Proto **)((ci->func->value_).f + 0x18);
    pc = currentpc(ci);
    base = (StkId)luaF_getlocalname(f,n,pc);
  }
  if (base == (StkId)0x0) {
    if (ci == L->ci) {
      local_60 = L->top;
    }
    else {
      local_60 = ci->next->func;
    }
    if (((long)local_60 - (long)limit >> 4 < (long)n) || (n < 1)) {
      return (char *)0x0;
    }
    base = (StkId)anon_var_dwarf_45d7;
  }
  *pos = limit + (n + -1);
  return (char *)base;
}

Assistant:

static const char *findlocal (lua_State *L, CallInfo *ci, int n,
                              StkId *pos) {
  const char *name = NULL;
  StkId base;
  if (isLua(ci)) {
    if (n < 0)  /* access to vararg values? */
      return findvararg(ci, -n, pos);
    else {
      base = ci->u.l.base;
      name = luaF_getlocalname(ci_func(ci)->p, n, currentpc(ci));
    }
  }
  else
    base = ci->func + 1;
  if (name == NULL) {  /* no 'standard' name? */
    StkId limit = (ci == L->ci) ? L->top : ci->next->func;
    if (limit - base >= n && n > 0)  /* is 'n' inside 'ci' stack? */
      name = "(*temporary)";  /* generic name for any valid slot */
    else
      return NULL;  /* no name */
  }
  *pos = base + (n - 1);
  return name;
}